

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

void anon_unknown.dwarf_107107::ReplaceValue
               (VmModule *module,VmValue *value,VmValue *original,VmValue *replacement)

{
  uint uVar1;
  long lVar2;
  VmValueType VVar3;
  VmBlock *pVVar4;
  long lVar5;
  VmConstant *pVVar6;
  VmConstant *third;
  VmConstant *pVVar7;
  VmConstant *fourth;
  int iVar8;
  VmInstructionType VVar9;
  VmValue *pVVar10;
  VmModule *module_00;
  ulong uVar11;
  VmBlock *block;
  
  if (original == (VmValue *)0x0) {
    __assert_fail("original",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x3f4,
                  "void (anonymous namespace)::ReplaceValue(VmModule *, VmValue *, VmValue *, VmValue *)"
                 );
  }
  if (replacement == (VmValue *)0x0) {
    __assert_fail("replacement",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x3f5,
                  "void (anonymous namespace)::ReplaceValue(VmModule *, VmValue *, VmValue *, VmValue *)"
                 );
  }
  if (value == (VmValue *)0x0) {
LAB_0019cd3d:
    __assert_fail("!\"unknown type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x488,
                  "void (anonymous namespace)::ReplaceValue(VmModule *, VmValue *, VmValue *, VmValue *)"
                 );
  }
  uVar1 = value->typeID;
  if (uVar1 == 2) {
    iVar8 = *(int *)&value[1]._vptr_VmValue;
    if ((iVar8 != 0x4d) || (replacement->typeID != 1)) {
      VVar3 = value[1].type.type;
      if (VVar3 == VM_TYPE_VOID) {
        VVar3 = VM_TYPE_VOID;
      }
      else {
        uVar11 = 0;
        do {
          if (*(VmValue **)(*(long *)&value[1].typeID + uVar11 * 8) == original) {
            VmValue::AddUse(replacement,value);
            if (value[1].type.type <= uVar11) goto LAB_0019cd1e;
            *(VmValue **)(*(long *)&value[1].typeID + uVar11 * 8) = replacement;
            VmValue::RemoveUse(original,value);
            VVar3 = value[1].type.type;
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < VVar3);
        iVar8 = *(int *)&value[1]._vptr_VmValue;
      }
      switch(iVar8) {
      case 0:
      case 1:
      case 2:
      case 3:
      case 4:
      case 5:
      case 6:
      case 8:
      case 9:
      case 10:
      case 0xb:
      case 0xc:
      case 0xd:
      case 0xe:
        if (VVar3 == VM_TYPE_VOID) {
LAB_0019cd1e:
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x199,
                        "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                       );
        }
        lVar2 = **(long **)&value[1].typeID;
        if (lVar2 == 0) {
          return;
        }
        if (*(int *)(lVar2 + 8) != 1) {
          return;
        }
        if (VVar3 == VM_TYPE_INT) goto LAB_0019cd1e;
        lVar5 = (*(long **)&value[1].typeID)[1];
        if ((lVar5 == 0) || (*(int *)(lVar5 + 8) != 1)) {
          lVar5 = 0;
        }
        if (*(VariableData **)(lVar2 + 200) == (VariableData *)0x0) {
          return;
        }
        if (*(int *)(lVar5 + 0x98) == 0) {
          return;
        }
        third = (VmConstant *)0x0;
        pVVar7 = CreateConstantPointer
                           (module->allocator,(SynBase *)0x0,
                            *(int *)(lVar5 + 0x98) + *(int *)(lVar2 + 0x98),
                            *(VariableData **)(lVar2 + 200),*(TypeBase **)(lVar2 + 0x18),true);
        VVar9 = *(VmInstructionType *)&value[1]._vptr_VmValue;
        pVVar6 = CreateConstantInt(module->allocator,(SynBase *)0x0,0);
        if (value[1].type.type == VM_TYPE_LONG) {
          third = *(VmConstant **)(*(long *)&value[1].typeID + 0x10);
        }
        module_00 = (VmModule *)module->allocator;
        fourth = (VmConstant *)0x0;
        pVVar10 = (VmValue *)0x0;
        break;
      default:
        goto switchD_0019c943_caseD_7;
      case 0x1b:
        if (VVar3 == VM_TYPE_VOID) goto LAB_0019cd1e;
        lVar2 = **(long **)&value[1].typeID;
        if ((lVar2 != 0) && (*(int *)(lVar2 + 8) == 1)) {
          if (VVar3 == VM_TYPE_INT) goto LAB_0019cd1e;
          lVar5 = (*(long **)&value[1].typeID)[1];
          if ((lVar5 == 0) || (*(int *)(lVar5 + 8) != 1)) {
            lVar5 = 0;
          }
          if ((*(VariableData **)(lVar2 + 200) != (VariableData *)0x0) &&
             (*(int *)(lVar5 + 0x98) != 0)) {
            pVVar6 = CreateConstantPointer
                               (module->allocator,(SynBase *)0x0,
                                *(int *)(lVar5 + 0x98) + *(int *)(lVar2 + 0x98),
                                *(VariableData **)(lVar2 + 200),*(TypeBase **)(lVar2 + 0x18),true);
            VVar9 = *(VmInstructionType *)&value[1]._vptr_VmValue;
            pVVar7 = CreateConstantInt(module->allocator,(SynBase *)0x0,0);
            VVar3 = value[1].type.type;
            if ((VVar3 < VM_TYPE_LONG) || ((VVar3 == VM_TYPE_LONG || (VVar3 < VM_TYPE_FUNCTION))))
            goto LAB_0019cd1e;
            lVar2 = *(long *)&value[1].typeID;
            ChangeInstructionTo((VmModule *)module->allocator,(VmInstruction *)value,VVar9,
                                &pVVar6->super_VmValue,&pVVar7->super_VmValue,
                                *(VmValue **)(lVar2 + 0x10),*(VmValue **)(lVar2 + 0x18),
                                *(VmValue **)(lVar2 + 0x20),(uint *)0x0);
            VVar3 = value[1].type.type;
          }
        }
        if (VVar3 < VM_TYPE_LONG) goto LAB_0019cd1e;
        lVar2 = *(long *)(*(long *)&value[1].typeID + 0x10);
        if (lVar2 == 0) {
          return;
        }
        if (*(int *)(lVar2 + 8) != 1) {
          return;
        }
        if (VVar3 == VM_TYPE_LONG) goto LAB_0019cd1e;
        lVar5 = *(long *)(*(long *)&value[1].typeID + 0x18);
        if ((lVar5 == 0) || (*(int *)(lVar5 + 8) != 1)) {
          lVar5 = 0;
        }
        if (*(VariableData **)(lVar2 + 200) == (VariableData *)0x0) {
          return;
        }
        if (*(int *)(lVar5 + 0x98) == 0) {
          return;
        }
        third = CreateConstantPointer
                          (module->allocator,(SynBase *)0x0,
                           *(int *)(lVar5 + 0x98) + *(int *)(lVar2 + 0x98),
                           *(VariableData **)(lVar2 + 200),*(TypeBase **)(lVar2 + 0x18),true);
        VVar3 = value[1].type.type;
        if ((VVar3 == VM_TYPE_VOID) || (VVar3 == VM_TYPE_INT)) goto LAB_0019cd1e;
        VVar9 = *(VmInstructionType *)&value[1]._vptr_VmValue;
        pVVar7 = (VmConstant *)**(undefined8 **)&value[1].typeID;
        pVVar6 = (VmConstant *)(*(undefined8 **)&value[1].typeID)[1];
        fourth = CreateConstantInt(module->allocator,(SynBase *)0x0,0);
        if (value[1].type.type < VM_TYPE_FUNCTION) goto LAB_0019cd1e;
        pVVar10 = *(VmValue **)(*(long *)&value[1].typeID + 0x20);
        module_00 = (VmModule *)module->allocator;
        break;
      case 0x33:
      case 0x34:
      case 0x35:
      case 0x36:
      case 0x37:
      case 0x38:
      case 0x39:
      case 0x3a:
      case 0x3b:
      case 0x3c:
      case 0x3d:
      case 0x3e:
      case 0x3f:
      case 0x40:
      case 0x41:
      case 0x42:
      case 0x43:
        if (VVar3 < VM_TYPE_DOUBLE) goto LAB_0019cd1e;
        lVar2 = *(long *)(*(long *)&value[1].typeID + 8);
        if (lVar2 == 0) {
          return;
        }
        if (*(int *)(lVar2 + 8) != 1) {
          return;
        }
        if (VVar3 == VM_TYPE_DOUBLE) goto LAB_0019cd1e;
        lVar5 = *(long *)(*(long *)&value[1].typeID + 0x10);
        if ((lVar5 == 0) || (*(int *)(lVar5 + 8) != 1)) {
          lVar5 = 0;
        }
        if (*(VariableData **)(lVar2 + 200) == (VariableData *)0x0) {
          return;
        }
        if (*(int *)(lVar5 + 0x98) == 0) {
          return;
        }
        pVVar6 = CreateConstantPointer
                           (module->allocator,(SynBase *)0x0,
                            *(int *)(lVar5 + 0x98) + *(int *)(lVar2 + 0x98),
                            *(VariableData **)(lVar2 + 200),*(TypeBase **)(lVar2 + 0x18),true);
        if (value[1].type.type == VM_TYPE_VOID) goto LAB_0019cd1e;
        VVar9 = *(VmInstructionType *)&value[1]._vptr_VmValue;
        pVVar7 = (VmConstant *)**(undefined8 **)&value[1].typeID;
        third = CreateConstantInt(module->allocator,(SynBase *)0x0,0);
        if (value[1].type.type < VM_TYPE_BLOCK) goto LAB_0019cd1e;
        fourth = *(VmConstant **)(*(long *)&value[1].typeID + 0x18);
        module_00 = (VmModule *)module->allocator;
        pVVar10 = (VmValue *)0x0;
      }
      ChangeInstructionTo(module_00,(VmInstruction *)value,VVar9,&pVVar7->super_VmValue,
                          &pVVar6->super_VmValue,&third->super_VmValue,&fourth->super_VmValue,
                          pVVar10,(uint *)0x0);
    }
  }
  else if (uVar1 == 3) {
    for (pVVar10 = (VmValue *)value[1].comment.end; pVVar10 != (VmValue *)0x0;
        pVVar10 = pVVar10[1].users.little[0]) {
      if (pVVar10 == original) {
        __assert_fail("curr != original",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x418,
                      "void (anonymous namespace)::ReplaceValue(VmModule *, VmValue *, VmValue *, VmValue *)"
                     );
      }
      ReplaceValue(module,pVVar10,original,replacement);
    }
  }
  else {
    if (uVar1 != 4) goto LAB_0019cd3d;
    pVVar10 = (VmValue *)value[1].source;
    if (pVVar10 == original) {
      VmValue::AddUse(replacement,value);
      VmValue::RemoveUse(original,value);
      pVVar10 = (VmValue *)value[1].source;
    }
    if (pVVar10 == (VmValue *)0x0) {
      pVVar4 = (VmBlock *)0x0;
    }
    else {
      do {
        if ((pVVar10 == original) && ((VmValue *)value[1].source != original)) {
          __assert_fail("curr != original || curr == function->firstBlock",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x401,
                        "void (anonymous namespace)::ReplaceValue(VmModule *, VmValue *, VmValue *, VmValue *)"
                       );
        }
        ReplaceValue(module,pVVar10,original,replacement);
        pVVar10 = (VmValue *)pVVar10[1].comment.begin;
      } while (pVVar10 != (VmValue *)0x0);
      pVVar4 = (VmBlock *)value[1].source;
    }
    block = (VmBlock *)0x0;
    if (replacement->typeID == 3) {
      block = (VmBlock *)replacement;
    }
    if (block != pVVar4) {
      VmFunction::DetachBlock((VmFunction *)value,block);
      block->parent = (VmFunction *)value;
      pVVar4 = (VmBlock *)value[1].source;
      block->nextSibling = pVVar4;
      pVVar4->prevSibling = block;
      value[1].source = (SynBase *)block;
    }
  }
switchD_0019c943_caseD_7:
  return;
}

Assistant:

void ReplaceValue(VmModule *module, VmValue *value, VmValue *original, VmValue *replacement)
	{
		assert(original);
		assert(replacement);

		if(VmFunction *function = getType<VmFunction>(value))
		{
			if(original == function->firstBlock)
			{
				replacement->AddUse(function);
				original->RemoveUse(function);
			}

			for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
			{
				assert(curr != original || curr == function->firstBlock); // Function can only use first block

				ReplaceValue(module, curr, original, replacement);
			}

			// Move replacement block to first position
			VmBlock *block = getType<VmBlock>(replacement);

			if(block != function->firstBlock)
			{
				function->DetachBlock(block);

				block->parent = function;
				block->nextSibling = function->firstBlock;

				function->firstBlock->prevSibling = block;
				function->firstBlock = block;
			}
		}
		else if(VmBlock *block = getType<VmBlock>(value))
		{
			for(VmInstruction *curr = block->firstInstruction; curr; curr = curr->nextSibling)
			{
				assert(curr != original); // Block doesn't use instructions

				ReplaceValue(module, curr, original, replacement);
			}
		}
		else if(VmInstruction *inst = getType<VmInstruction>(value))
		{
			// Can't replace phi instruction argument with a constant
			if(inst->cmd == VM_INST_PHI && isType<VmConstant>(replacement))
				return;

			for(unsigned i = 0; i < inst->arguments.size(); i++)
			{
				if(inst->arguments[i] == original)
				{
					replacement->AddUse(inst);

					inst->arguments[i] = replacement;

					original->RemoveUse(inst);
				}
			}

			// Legalize constant offset in load/store instruction
			switch(inst->cmd)
			{
			case VM_INST_LOAD_BYTE:
			case VM_INST_LOAD_SHORT:
			case VM_INST_LOAD_INT:
			case VM_INST_LOAD_FLOAT:
			case VM_INST_LOAD_DOUBLE:
			case VM_INST_LOAD_LONG:
			case VM_INST_LOAD_STRUCT:
			case VM_INST_STORE_BYTE:
			case VM_INST_STORE_SHORT:
			case VM_INST_STORE_INT:
			case VM_INST_STORE_FLOAT:
			case VM_INST_STORE_DOUBLE:
			case VM_INST_STORE_LONG:
			case VM_INST_STORE_STRUCT:
				if(VmConstant *address = getType<VmConstant>(inst->arguments[0]))
				{
					VmConstant *offset = getType<VmConstant>(inst->arguments[1]);

					if(address->container && offset->iValue != 0)
					{
						VmConstant *target = CreateConstantPointer(module->allocator, NULL, address->iValue + offset->iValue, address->container, address->type.structType, true);

						ChangeInstructionTo(module, inst, inst->cmd, target, CreateConstantInt(module->allocator, NULL, 0), inst->arguments.size() == 3 ? inst->arguments[2] : NULL, NULL, NULL, NULL);
					}
				}
				break;
			case VM_INST_MEM_COPY:
				if(VmConstant *address = getType<VmConstant>(inst->arguments[0]))
				{
					VmConstant *offset = getType<VmConstant>(inst->arguments[1]);

					if(address->container && offset->iValue != 0)
					{
						VmConstant *target = CreateConstantPointer(module->allocator, NULL, address->iValue + offset->iValue, address->container, address->type.structType, true);

						ChangeInstructionTo(module, inst, inst->cmd, target, CreateConstantInt(module->allocator, NULL, 0), inst->arguments[2], inst->arguments[3], inst->arguments[4], NULL);
					}
				}

				if(VmConstant *address = getType<VmConstant>(inst->arguments[2]))
				{
					VmConstant *offset = getType<VmConstant>(inst->arguments[3]);

					if(address->container && offset->iValue != 0)
					{
						VmConstant *target = CreateConstantPointer(module->allocator, NULL, address->iValue + offset->iValue, address->container, address->type.structType, true);

						ChangeInstructionTo(module, inst, inst->cmd, inst->arguments[0], inst->arguments[1], target, CreateConstantInt(module->allocator, NULL, 0), inst->arguments[4], NULL);
					}
				}
				break;
			case VM_INST_ADD_LOAD:
			case VM_INST_SUB_LOAD:
			case VM_INST_MUL_LOAD:
			case VM_INST_DIV_LOAD:
			case VM_INST_POW_LOAD:
			case VM_INST_MOD_LOAD:
			case VM_INST_LESS_LOAD:
			case VM_INST_GREATER_LOAD:
			case VM_INST_LESS_EQUAL_LOAD:
			case VM_INST_GREATER_EQUAL_LOAD:
			case VM_INST_EQUAL_LOAD:
			case VM_INST_NOT_EQUAL_LOAD:
			case VM_INST_SHL_LOAD:
			case VM_INST_SHR_LOAD:
			case VM_INST_BIT_AND_LOAD:
			case VM_INST_BIT_OR_LOAD:
			case VM_INST_BIT_XOR_LOAD:
				if(VmConstant *address = getType<VmConstant>(inst->arguments[1]))
				{
					VmConstant *offset = getType<VmConstant>(inst->arguments[2]);

					if(address->container && offset->iValue != 0)
					{
						VmConstant *target = CreateConstantPointer(module->allocator, NULL, address->iValue + offset->iValue, address->container, address->type.structType, true);

						ChangeInstructionTo(module, inst, inst->cmd, inst->arguments[0], target, CreateConstantInt(module->allocator, NULL, 0), inst->arguments[3], NULL, NULL);
					}
				}
				break;
			default:
				break;
			}
		}
		else
		{
			assert(!"unknown type");
		}
	}